

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O3

ssl_hs_wait_t bssl::ssl_client_handshake(SSL_HANDSHAKE *hs)

{
  InplaceVector<unsigned_char,_32UL> *__src;
  byte bVar1;
  ushort uVar2;
  _Head_base<0UL,_buf_mem_st_*,_false> _Var3;
  _Head_base<0UL,_ssl_session_st_*,_false> session;
  EVP_PKEY *pkey;
  _func_3149 *p_Var4;
  CERT *pCVar5;
  _func_int_SSL_ptr_void_ptr *p_Var6;
  SSL_CREDENTIAL *cred;
  SSL_CONFIG *pSVar7;
  SSL *ssl;
  _func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> premaster;
  pointer __p_00;
  pointer __p_01;
  Span<const_unsigned_char> signature;
  undefined1 auVar12 [8];
  size_t sVar13;
  bool bVar14;
  undefined1 uVar15;
  char cVar16;
  uint16_t uVar17;
  undefined2 uVar18;
  uint16_t uVar19;
  int iVar20;
  ssl_private_key_result_t sVar21;
  ssl_verify_result_t sVar22;
  ssl_hs_wait_t sVar23;
  int iVar24;
  uint32_t uVar25;
  uint uVar26;
  uint uVar27;
  SSLSessionType SVar28;
  uint uVar29;
  CRYPTO_BUFFER *pCVar30;
  uchar *puVar31;
  ulong uVar32;
  char *__p_02;
  size_t sVar33;
  RSA *rsa;
  undefined1 *puVar34;
  SSL_CIPHER *pSVar35;
  OPENSSL_STACK *sk;
  ssl_session_st *psVar36;
  ssl_session_st *psVar37;
  SSL_SESSION *extraout_RDX;
  SSL_SESSION *extraout_RDX_00;
  SSL_SESSION *extraout_RDX_01;
  SSL_SESSION *pSVar38;
  ssl_hs_wait_t sVar39;
  ssl_early_data_reason_t sVar40;
  long lVar41;
  pointer __p_3;
  SSL_SESSION *pSVar42;
  pointer __p_03;
  SSL *pSVar43;
  SSL *pSVar44;
  SSL_SESSION *in_R8;
  SSL_SESSION *in_R9;
  pointer __p;
  UniquePtr<SSL_SESSION> *pUVar45;
  long lVar46;
  ptrdiff_t _Num;
  Array<unsigned_char> *this;
  initializer_list<bssl::SSLExtension_*> extensions;
  Span<const_unsigned_char> protocol;
  Span<unsigned_char> out;
  Span<unsigned_char> out_enc;
  Span<const_unsigned_char> enc;
  Span<const_unsigned_char> protocol_00;
  size_t sig_len;
  uint16_t signature_algorithm;
  CBB child;
  uint8_t *ptr;
  char *raw;
  CBB body;
  uint8_t ech_enc [65];
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  SSL_SESSION *in_stack_fffffffffffffcf0;
  CBS local_308;
  UniquePtr<SSL_SESSION> *local_2f0;
  undefined8 local_2e8;
  ulong local_2e0;
  undefined1 local_2d8 [8];
  undefined1 auStack_2d0 [40];
  SSL *local_2a8;
  SSLTranscript *local_2a0;
  undefined1 local_298 [8];
  SSL_SESSION *pSStack_290;
  UniquePtr<EVP_PKEY> *local_268;
  Array<unsigned_char> *local_260;
  InplaceVector<unsigned_char,_32UL> *local_258;
  UniquePtr<SSL_SESSION> *local_250;
  UniquePtr<SSL_CREDENTIAL> *local_248;
  uint16_t *local_240;
  undefined1 local_238 [48];
  undefined1 local_208 [136];
  Array<unsigned_char> *local_180;
  _Head_base<0UL,_char_*,_false> local_178;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> local_170;
  undefined1 local_168 [48];
  size_t local_138;
  uint16_t local_130;
  uint8_t local_12e;
  CBS local_128 [12];
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_60;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_58;
  UniquePtr<SSLKeyShare> *local_50;
  uint8_t *local_48;
  SSL_SESSION *local_40;
  uint16_t *local_38;
  
  local_2f0 = &hs->new_session;
  local_248 = &hs->credential;
  local_2a0 = &hs->transcript;
  local_268 = &hs->peer_pubkey;
  local_170._M_head_impl = (stack_st_CRYPTO_BUFFER *)&hs->peer_psk_identity_hint;
  local_260 = &hs->peer_key;
  local_180 = &hs->certificate_types;
  local_60._M_head_impl = (crypto_buffer_st *)&hs->ca_names;
  local_178._M_head_impl = (char *)&hs->dtls_cookie;
  local_250 = &hs->early_session;
  local_50 = hs->key_shares;
  local_58._M_head_impl = (crypto_buffer_st *)(hs->key_shares + 1);
  local_240 = &hs->max_version;
  local_258 = &hs->session_id;
  local_40 = (SSL_SESSION *)&hs->early_traffic_secret;
  local_38 = &hs->min_version;
  local_48 = hs->inner_client_random;
  do {
    uVar27 = hs->state;
    uVar32 = (ulong)uVar27;
    sVar23 = ssl_hs_error;
    switch(uVar32) {
    case 0:
      pSVar43 = hs->ssl;
      ssl_do_info_callback(pSVar43,0x10,1);
      puVar34 = &pSVar43->s3->field_0xdc;
      *(ushort *)puVar34 = *(ushort *)puVar34 & 0xffdf;
      bVar14 = ssl_get_version_range(hs,local_38,local_240);
      sVar23 = ssl_hs_error;
      if (bVar14) {
        out_enc.size_ = (size_t)local_2d8;
        out_enc.data_ = (uchar *)0x41;
        bVar14 = ssl_select_ech_config
                           ((bssl *)hs,(SSL_HANDSHAKE *)local_168,out_enc,(size_t *)in_R8);
        sVar23 = ssl_hs_error;
        if (bVar14) {
          iVar24 = SSL_is_dtls(hs->ssl);
          uVar29 = (uint)hs->max_version;
          if (iVar24 == 0) {
            psVar37 = (ssl_session_st *)(ulong)uVar29;
            if (0x302 < uVar29) {
              psVar37 = (ssl_session_st *)0x303;
            }
          }
          else {
            psVar37 = (ssl_session_st *)(ulong)((uint)(uVar29 < 0x303) * 2 | 0xfefd);
          }
          hs->client_version = (uint16_t)psVar37;
          bVar14 = ssl_setup_pake_shares(hs);
          if (bVar14) {
            pSVar38 = (pSVar43->session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            SVar28 = kNotResumable;
            if (pSVar38 != (SSL_SESSION *)0x0) {
              SVar28 = ssl_session_get_type(pSVar38);
              psVar36 = (pSVar43->session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              if (((psVar36->field_0x1b8 & 0x10) == 0) &&
                 (bVar14 = ssl_supports_version(hs,psVar36->ssl_version), bVar14)) {
                if ((hs->selected_ech_config)._M_t.
                    super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl == (ECHConfig *)0x0
                   ) {
                  pSVar38 = extraout_RDX;
                  if (SVar28 != kNotResumable) goto LAB_00146f50;
                }
                else {
                  uVar17 = ssl_session_protocol_version
                                     ((pSVar43->session)._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
                  if ((SVar28 != kNotResumable) && (pSVar38 = extraout_RDX_00, 0x303 < uVar17)) {
LAB_00146f50:
                    if (((SVar28 != kTicket) ||
                        (uVar25 = SSL_get_options(pSVar43), pSVar38 = extraout_RDX_01,
                        (uVar25 >> 0xe & 1) == 0)) &&
                       (((hs->pake_prover)._M_t.
                         super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>.
                         _M_t.
                         super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>
                         .super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl ==
                         (Prover *)0x0 &&
                        (bVar14 = ssl_session_is_time_valid
                                            ((bssl *)pSVar43,
                                             (SSL *)(pSVar43->session)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl,pSVar38), bVar14)))) {
                      uVar29 = SSL_is_quic(pSVar43);
                      psVar37 = (pSVar43->session)._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                      if ((uVar29 == ((*(uint *)&psVar37->field_0x1b8 >> 5 & 1) != 0)) &&
                         ((pSVar43->s3->field_0xdc & 0x10) == 0)) goto LAB_00146fb4;
                    }
                  }
                }
              }
              SVar28 = kNotResumable;
              ssl_set_session(pSVar43,(SSL_SESSION *)0x0);
            }
LAB_00146fb4:
            iVar24 = RAND_bytes(pSVar43->s3->client_random,0x20);
            sVar23 = ssl_hs_error;
            if ((iVar24 != 0) &&
               (((hs->selected_ech_config)._M_t.
                 super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl == (ECHConfig *)0x0 ||
                (iVar24 = RAND_bytes(local_48,0x20), iVar24 != 0)))) {
              if ((*local_240 < 0x304) || (iVar24 = SSL_is_quic(pSVar43), iVar24 != 0)) {
                bVar14 = false;
              }
              else {
                iVar24 = SSL_is_dtls(pSVar43);
                bVar14 = iVar24 == 0;
              }
              if (SVar28 == kTicket) {
LAB_0014706b:
                (hs->session_id).size_ = ' ';
                iVar24 = RAND_bytes((uchar *)local_258,0x20);
                if (iVar24 == 0) goto LAB_00146a79;
              }
              else if (SVar28 == kID) {
                psVar36 = (pSVar43->session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                __src = &psVar36->session_id;
                if (local_258 != __src) {
                  bVar1 = (psVar36->session_id).size_;
                  if (0x20 < (ulong)bVar1) goto LAB_00147b7d;
                  (hs->session_id).size_ = '\0';
                  if (bVar1 != 0) {
                    memmove(local_258,__src,(ulong)bVar1);
                  }
                  (hs->session_id).size_ = bVar1;
                }
              }
              else if (bVar14) goto LAB_0014706b;
              ssl = hs->ssl;
              if ((ssl->field_0xa4 & 1) != 0) {
                __assert_fail("!ssl->server",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x126,
                              "ssl_early_data_reason_t bssl::should_offer_early_data(const SSL_HANDSHAKE *)"
                             );
              }
              sVar40 = ssl_early_data_disabled;
              if ((((ssl->field_0xa4 & 4) == 0) ||
                  (sVar40 = ssl_early_data_protocol_version, *local_240 < 0x304)) ||
                 (iVar24 = SSL_is_dtls(ssl), iVar24 != 0)) {
LAB_001470cb:
                pSVar43->s3->early_data_reason = sVar40;
              }
              else {
                pSVar38 = (ssl->session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                if (pSVar38 == (SSL_SESSION *)0x0) {
                  sVar40 = ssl_early_data_no_session_offered;
                  goto LAB_001470cb;
                }
                uVar17 = ssl_session_protocol_version(pSVar38);
                sVar40 = ssl_early_data_unsupported_for_session;
                if ((uVar17 < 0x304) ||
                   (psVar36 = (ssl->session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                   psVar36->ticket_max_early_data == 0)) goto LAB_001470cb;
                puVar31 = (uchar *)(psVar36->early_alpn).size_;
                if (puVar31 != (uchar *)0x0) {
                  protocol_00.size_ = (size_t)psVar37;
                  protocol_00.data_ = puVar31;
                  bVar14 = ssl_is_alpn_protocol_allowed
                                     ((bssl *)hs,(SSL_HANDSHAKE *)(psVar36->early_alpn).data_,
                                      protocol_00);
                  sVar40 = ssl_early_data_alpn_mismatch;
                  if (!bVar14) goto LAB_001470cb;
                  psVar36 = (ssl->session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  if ((psVar36->field_0x1b8 & 0x40) != 0) {
                    local_208._0_8_ =
                         (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0;
                    local_208._8_8_ = (pointer)0x0;
                    psVar37 = (ssl_session_st *)(psVar36->early_alpn).size_;
                    protocol.size_ = (size_t)in_R8;
                    protocol.data_ = (uchar *)psVar37;
                    bVar14 = ssl_get_local_application_settings
                                       ((bssl *)hs,(SSL_HANDSHAKE *)local_208,
                                        (Span<const_unsigned_char> *)(psVar36->early_alpn).data_,
                                        protocol);
                    if (((!bVar14) ||
                        (psVar36 = (ssl->session)._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                        (pointer)local_208._8_8_ !=
                        (pointer)(psVar36->local_application_settings).size_)) ||
                       (((pointer)local_208._8_8_ != (pointer)0x0 &&
                        (iVar24 = bcmp((void *)local_208._0_8_,
                                       (psVar36->local_application_settings).data_,local_208._8_8_),
                        iVar24 != 0)))) {
                      sVar40 = ssl_early_data_alps_mismatch;
                      goto LAB_001470cb;
                    }
                  }
                }
                hs->field_0x6c9 = hs->field_0x6c9 | 8;
              }
              sVar39 = ssl_hs_error;
              bVar14 = ssl_setup_key_shares(hs,0);
              sVar23 = ssl_hs_error;
              if ((((bVar14) &&
                   (bVar14 = ssl_setup_extension_permutation(hs), sVar23 = sVar39, bVar14)) &&
                  (enc.size_ = (size_t)psVar37, enc.data_ = (uchar *)local_2d8,
                  bVar14 = ssl_encrypt_client_hello((bssl *)hs,(SSL_HANDSHAKE *)local_168,enc),
                  bVar14)) && (bVar14 = ssl_add_client_hello(hs), bVar14)) {
                hs->state = 1;
                goto LAB_0014504c;
              }
            }
          }
        }
      }
      break;
    case 1:
      iVar24 = 3;
      if ((hs->field_0x6c9 & 8) != 0) {
        pSVar43 = hs->ssl;
        session._M_head_impl =
             (pSVar43->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        if (session._M_head_impl != (SSL_SESSION *)0x0) {
          SSL_SESSION_up_ref(session._M_head_impl);
        }
        local_168._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
        std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_250,
                   session._M_head_impl);
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_168);
        pSVar43->s3->version =
             ((hs->early_session)._M_t.
              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version;
        hs->field_0x6c9 = hs->field_0x6c9 | 0x40;
        iVar24 = 2;
      }
LAB_00145641:
      hs->state = iVar24;
      goto LAB_00145655;
    case 2:
      pSVar43 = hs->ssl;
      if (((pSVar43->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume == true) {
        sVar22 = ssl_reverify_peer_cert(hs,false);
        sVar23 = ssl_hs_error;
        if (sVar22 != ssl_verify_invalid) {
          if (sVar22 != ssl_verify_retry) goto LAB_00145660;
          sVar23 = ssl_hs_certificate_verify;
          iVar24 = 2;
LAB_00144fca:
          hs->state = iVar24;
        }
      }
      else {
LAB_00145660:
        bVar14 = (*pSVar43->method->add_change_cipher_spec)(pSVar43);
        sVar23 = ssl_hs_error;
        if (bVar14) {
          bVar14 = tls13_init_early_key_schedule
                             (hs,(hs->early_session)._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
          sVar23 = ssl_hs_error;
          if (bVar14) {
            bVar14 = tls13_derive_early_secret(hs);
            sVar23 = ssl_hs_error;
            if (bVar14) {
              in_R9 = (SSL_SESSION *)(ulong)(hs->early_traffic_secret).size_;
              traffic_secret.data_._4_4_ = in_stack_fffffffffffffcec;
              traffic_secret.data_._0_4_ = in_stack_fffffffffffffce8;
              traffic_secret.size_ = (size_t)in_stack_fffffffffffffcf0;
              in_R8 = local_40;
              bVar14 = tls13_set_traffic_key
                                 ((bssl *)hs->ssl,(SSL *)0x1,ssl_encryption_early_data,
                                  (evp_aead_direction_t)
                                  (hs->early_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                  local_40,traffic_secret);
              sVar23 = ssl_hs_error;
              if (bVar14) {
                hs->field_0x6c9 = hs->field_0x6c9 | 0x24;
                sVar23 = ssl_hs_early_return;
                iVar24 = 3;
                goto LAB_00144fca;
              }
            }
          }
        }
      }
      break;
    case 3:
      pSVar44 = (SSL *)hs->ssl;
      cVar16 = (**(code **)(*(long *)pSVar44 + 0x18))(pSVar44);
      sVar23 = ssl_hs_read_server_hello;
      if (cVar16 != '\0') {
        iVar24 = SSL_is_dtls((SSL *)pSVar44);
        if (((iVar24 == 0) || ((hs->field_0x6cb & 2) != 0)) || (local_208[1] != '\x03')) {
          local_168._16_2_ = ssl_hs_error;
          local_130 = 0;
          local_12e = '\0';
          local_308.data._0_1_ = 0x32;
          bVar14 = ssl_parse_server_hello
                             ((ParsedServerHello *)local_168,(uint8_t *)&local_308,
                              (SSLMessage *)local_208);
          if (!bVar14) {
LAB_00146de6:
            uVar29 = (uint)(byte)local_308.data;
            goto LAB_00146df3;
          }
          iVar24 = SSL_is_dtls(hs->ssl);
          uVar18 = 0xfefd;
          if (iVar24 == 0) {
            uVar18 = 0x303;
          }
          if (uVar18 == local_168._16_2_) {
            local_2d8._0_4_ = 0x1002b;
            auStack_2d0._0_8_ = (SSL_CONFIG *)0x0;
            auStack_2d0._8_8_ = (uint8_t *)0x0;
            local_238[0] = SUB81(local_128[0].data,0);
            local_238[1] = (char)((ulong)local_128[0].data >> 8);
            local_238._2_6_ = (undefined6)((ulong)local_128[0].data >> 0x10);
            local_238._8_8_ = local_128[0].len;
            local_298 = (undefined1  [8])local_2d8;
            extensions._M_len = 1;
            extensions._M_array = (iterator)0x1;
            in_R8 = (SSL_SESSION *)0x1;
            bVar14 = ssl_parse_extensions
                               ((bssl *)local_238,&local_308,local_298,extensions,SUB81(in_R9,0));
            if (!bVar14) goto LAB_00146de6;
            if (local_2d8[3] == '\0') goto LAB_00146ac1;
            iVar24 = CBS_get_u16((CBS *)auStack_2d0,(uint16_t *)local_298);
            if ((iVar24 == 0) || ((uint8_t *)auStack_2d0._8_8_ != (uint8_t *)0x0)) {
              local_308.data._0_1_ = 0x32;
              goto LAB_00146de6;
            }
            uVar18 = local_298._0_2_;
          }
          else {
LAB_00146ac1:
            local_298._0_2_ = local_168._16_2_;
            uVar18 = local_168._16_2_;
          }
          bVar14 = ssl_supports_version(hs,uVar18);
          if (bVar14) {
            p_Var4 = pSVar44->handshake_func;
            if (((byte)p_Var4[0xdc] & 0x10) == 0) {
              if ((*(uint16_t *)(p_Var4 + 0xd0) != 0) &&
                 (((hs->field_0x6c9 & 0x40) == 0 ||
                  (*(uint16_t *)(p_Var4 + 0xd0) !=
                   ((local_250->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                    ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version)))) {
                __assert_fail("ssl->s3->version == 0 || (hs->is_early_version && ssl->s3->version == hs->early_session->ssl_version)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x262,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              *(undefined2 *)(p_Var4 + 0xd0) = local_298._0_2_;
              uVar29 = *(uint *)&hs->field_0x6c8 & 0xffffbfff;
              *(uint *)&hs->field_0x6c8 = uVar29;
            }
            else {
              if (local_298._0_2_ != *(uint16_t *)(p_Var4 + 0xd0)) {
                iVar24 = 0xf6;
                in_R8 = (SSL_SESSION *)0x266;
                goto LAB_00146b58;
              }
              uVar29 = *(uint *)&hs->field_0x6c8;
            }
            if (((uVar29 >> 0xb & 1) != 0) &&
               (*(uint16_t *)(pSVar44->handshake_func + 0xd0) !=
                ((local_250->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ssl_version)) {
              uVar17 = ssl_protocol_version((SSL *)pSVar44);
              if (0x303 < uVar17) {
                __assert_fail("ssl_protocol_version(ssl) < TLS1_3_VERSION",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x272,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              uVar17 = ssl_session_protocol_version
                                 ((local_250->_M_t).
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
              if (uVar17 < 0x304) {
                __assert_fail("ssl_session_protocol_version(hs->early_session.get()) >= TLS1_3_VERSION"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x274,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              iVar24 = SSL_is_dtls((SSL *)pSVar44);
              if (iVar24 != 0) {
                __assert_fail("!SSL_is_dtls(ssl)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x284,
                              "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)");
              }
              hs->field_0x6c9 = hs->field_0x6c9 & 0xdf;
              iVar24 = 0x116;
              in_R8 = (SSL_SESSION *)0x286;
              goto LAB_00146b58;
            }
            uVar17 = ssl_protocol_version((SSL *)pSVar44);
            if (0x303 < uVar17) {
              if ((hs->field_0x6cb & 2) == 0) {
                hs->state = 4;
                goto LAB_00144c76;
              }
              iVar24 = 0x9f;
              in_R8 = (SSL_SESSION *)0x28d;
              goto LAB_00146b58;
            }
            if ((hs->pake_prover)._M_t.
                super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl !=
                (Prover *)0x0) {
              iVar24 = 0xf0;
              in_R8 = (SSL_SESSION *)0x299;
              goto LAB_00146b58;
            }
            std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)local_50,
                       (pointer)0x0);
            std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)
                       local_58._M_head_impl,(pointer)0x0);
            ssl_done_writing_client_hello(hs);
            p_Var4 = pSVar44->handshake_func;
            if ((hs->selected_ech_config)._M_t.
                super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl != (ECHConfig *)0x0) {
              *(undefined4 *)(p_Var4 + 0xd8) = 2;
            }
            uVar9 = *(undefined8 *)local_168._24_8_;
            uVar10 = *(undefined8 *)(local_168._24_8_ + 8);
            uVar11 = *(undefined8 *)(local_168._24_8_ + 0x18);
            *(undefined8 *)(p_Var4 + 0x20) = *(undefined8 *)(local_168._24_8_ + 0x10);
            *(undefined8 *)(p_Var4 + 0x28) = uVar11;
            *(undefined8 *)(p_Var4 + 0x10) = uVar9;
            *(undefined8 *)(p_Var4 + 0x18) = uVar10;
            p_Var4 = pSVar44->handshake_func;
            if (((((byte)p_Var4[0xdc] & 0x10) == 0) && (0x303 < *local_240)) &&
               ((*(char (*) [8])(p_Var4 + 0x28) == (char  [8])0x4452474e574f44 ||
                ((*(long *)(p_Var4 + 0x28) == 0x14452474e574f44 ||
                 (*(long *)(p_Var4 + 0x28) == -0xefb83d574b4013)))))) {
              iVar24 = 0x129;
              in_R8 = (SSL_SESSION *)0x2b9;
              goto LAB_00147405;
            }
            pSVar35 = SSL_get_cipher_by_value(local_130);
            p_Var8 = hs->config->psk_client_callback;
            if (((pSVar35 == (SSL_CIPHER *)0x0) ||
                ((pSVar35->algorithm_mkey &
                 (uint)(p_Var8 == (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0)
                 << 2) != 0)) ||
               ((pSVar35->algorithm_auth &
                (uint)(p_Var8 == (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0)
                << 3) != 0)) {
LAB_001473e9:
              iVar24 = 0xf2;
              in_R8 = (SSL_SESSION *)0x2c9;
            }
            else {
              uVar17 = SSL_CIPHER_get_min_version(pSVar35);
              uVar19 = ssl_protocol_version((SSL *)pSVar44);
              if (uVar19 < uVar17) goto LAB_001473e9;
              uVar17 = SSL_CIPHER_get_max_version(pSVar35);
              uVar19 = ssl_protocol_version((SSL *)pSVar44);
              if (uVar17 < uVar19) goto LAB_001473e9;
              sk = (OPENSSL_STACK *)SSL_get_ciphers(pSVar44);
              iVar24 = OPENSSL_sk_find(sk,(size_t *)0x0,pSVar35,sk_SSL_CIPHER_call_cmp_func);
              pUVar45 = local_2f0;
              if (iVar24 == 0) goto LAB_001473e9;
              hs->new_cipher = pSVar35;
              uVar32 = (ulong)(hs->session_id).size_;
              if (((uVar32 == 0) || (local_138 != uVar32)) ||
                 (iVar24 = bcmp((void *)local_168._40_8_,local_258,local_138), iVar24 != 0)) {
                ssl_set_session((SSL *)pSVar44,(SSL_SESSION *)0x0);
                bVar14 = ssl_get_new_session(hs);
                sVar13 = local_138;
                if (bVar14) {
                  if (0x20 < local_138) {
LAB_00147b7d:
                    abort();
                  }
                  psVar37 = (pUVar45->_M_t).
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  (psVar37->session_id).size_ = '\0';
                  psVar36 = psVar37;
                  if (local_138 != 0) {
                    memmove(&psVar37->session_id,(void *)local_168._40_8_,local_138);
                    psVar36 = (pUVar45->_M_t).
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  }
                  (psVar37->session_id).size_ = (PackedSize<32UL>)sVar13;
                  psVar36->cipher = hs->new_cipher;
LAB_0014735f:
                  uVar17 = ssl_protocol_version((SSL *)pSVar44);
                  bVar14 = SSLTranscript::InitHash(local_2a0,uVar17,hs->new_cipher);
                  if ((bVar14) && (bVar14 = ssl_hash_message(hs,(SSLMessage *)local_208), bVar14)) {
                    if ((pSVar44->init_msg != (void *)0x0) ||
                       (bVar14 = ssl_cipher_uses_certificate_auth(hs->new_cipher), !bVar14)) {
                      SSLTranscript::FreeBuffer(local_2a0);
                    }
                    if (local_12e == '\0') {
                      bVar14 = ssl_parse_serverhello_tlsext(hs,local_128);
                      if (!bVar14) {
                        in_R8 = (SSL_SESSION *)0x319;
                        ERR_put_error(0x10,0,0xbe,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                      ,0x319);
                        sVar23 = ssl_hs_error;
                        break;
                      }
                      if ((pSVar44->init_msg == (void *)0x0) ||
                         (bVar1 = *(byte *)((long)pSVar44->init_msg + 0x1b8),
                         (*(uint *)&hs->field_0x6c8 >> 0x11 & 1) == (bVar1 & 1))) {
                        (**(code **)(*(long *)pSVar44 + 0x20))(pSVar44);
                        if (pSVar44->init_msg == (void *)0x0) {
                          hs->state = 5;
                        }
                        else if ((pSVar44->packet[0x178] == '\x01') &&
                                (bVar14 = ssl_cipher_uses_certificate_auth(hs->new_cipher), bVar14))
                        {
                          hs->state = 8;
                        }
                        else {
                          hs->state = 0x11;
                        }
                        goto LAB_00144c76;
                      }
                      if ((bVar1 & 1) == 0) {
                        iVar24 = 0xcd;
                        in_R8 = (SSL_SESSION *)0x322;
                      }
                      else {
                        iVar24 = 0xcc;
                        in_R8 = (SSL_SESSION *)0x320;
                      }
                      ERR_put_error(0x10,0,iVar24,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                    ,(int)in_R8);
                      uVar29 = 0x28;
                      goto LAB_00146df3;
                    }
                    iVar24 = 0xee;
                    in_R8 = (SSL_SESSION *)0x313;
                    goto LAB_00147405;
                  }
                }
                uVar29 = 0x50;
                goto LAB_00146df3;
              }
              pSVar38 = (SSL_SESSION *)pSVar44->init_msg;
              if ((pSVar38 == (SSL_SESSION *)0x0) || (*(int *)(pSVar44->handshake_func + 0xd8) == 2)
                 ) {
                iVar24 = 0x11e;
                in_R8 = (SSL_SESSION *)0x2da;
              }
              else if (pSVar38->ssl_version == *(uint16_t *)(pSVar44->handshake_func + 0xd0)) {
                if (pSVar38->cipher == pSVar35) {
                  bVar14 = ssl_session_is_context_valid(hs,pSVar38);
                  if (bVar14) {
                    uVar2 = *(ushort *)(pSVar44->handshake_func + 0xdc);
                    if ((uVar2 & 0x10) != 0) {
                      __assert_fail("!ssl->s3->initial_handshake_complete",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                    ,0x2f0,
                                    "enum ssl_hs_wait_t bssl::do_read_server_hello(SSL_HANDSHAKE *)"
                                   );
                    }
                    *(ushort *)(pSVar44->handshake_func + 0xdc) = uVar2 | 0x20;
                    goto LAB_0014735f;
                  }
                  iVar24 = 0x65;
                  in_R8 = (SSL_SESSION *)0x2eb;
                }
                else {
                  iVar24 = 0xbb;
                  in_R8 = (SSL_SESSION *)0x2e4;
                }
              }
              else {
                iVar24 = 0xbc;
                in_R8 = (SSL_SESSION *)0x2df;
              }
            }
LAB_00147405:
            ERR_put_error(0x10,0,iVar24,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,(int)in_R8);
            iVar24 = 0x2f;
          }
          else {
            iVar24 = 0xf0;
            in_R8 = (SSL_SESSION *)0x258;
LAB_00146b58:
            ERR_put_error(0x10,0,iVar24,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,(int)in_R8);
            iVar24 = 0x46;
          }
          ssl_send_alert((SSL *)pSVar44,2,iVar24);
          sVar23 = ssl_hs_error;
        }
        else {
          pSVar44 = (SSL *)hs->ssl;
          iVar24 = SSL_is_dtls((SSL *)pSVar44);
          if (iVar24 == 0) {
            __assert_fail("SSL_is_dtls(ssl)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x1ff,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          if (local_208[1] != '\x03') {
            __assert_fail("msg.type == DTLS1_MT_HELLO_VERIFY_REQUEST",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x200,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          if ((hs->field_0x6cb & 2) != 0) {
            __assert_fail("!hs->received_hello_verify_request",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x201,
                          "bool bssl::handle_hello_verify_request(SSL_HANDSHAKE *, const SSLMessage &)"
                         );
          }
          local_168._0_8_ = local_208._8_8_;
          local_168._8_8_ = local_208._16_8_;
          iVar24 = CBS_get_u16((CBS *)local_168,(uint16_t *)local_238);
          if (((iVar24 == 0) ||
              (iVar24 = CBS_get_u8_length_prefixed((CBS *)local_168,(CBS *)local_2d8),
              uVar9 = auStack_2d0._0_8_, auVar12 = local_2d8, iVar24 == 0)) ||
             ((SSL_CONFIG *)local_168._8_8_ != (SSL_CONFIG *)0x0)) {
            in_R8 = (SSL_SESSION *)0x208;
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x208);
            uVar29 = 0x32;
LAB_00146df3:
            ssl_send_alert((SSL *)pSVar44,2,uVar29);
          }
          else {
            bVar14 = Array<unsigned_char>::InitUninitialized
                               ((Array<unsigned_char> *)local_178._M_head_impl,auStack_2d0._0_8_);
            if ((SSL_CONFIG *)uVar9 != (SSL_CONFIG *)0x0 && bVar14) {
              memmove(*(void **)local_178._M_head_impl,(void *)auVar12,uVar9);
            }
            uVar29 = 0x50;
            if (!bVar14) goto LAB_00146df3;
            hs->field_0x6cb = hs->field_0x6cb | 2;
            (**(code **)(*(long *)pSVar44 + 0x20))(pSVar44);
            bVar14 = SSLTranscript::Init(local_2a0);
            if (bVar14) {
              bVar14 = ssl_add_client_hello(hs);
              sVar23 = ssl_hs_error;
              if (bVar14) {
                hs->field_0x6cb = hs->field_0x6cb | 2;
                hs->state = 3;
                sVar23 = ssl_hs_flush;
              }
              break;
            }
          }
          sVar23 = ssl_hs_error;
        }
      }
      break;
    case 4:
      sVar23 = tls13_client_handshake(hs);
      if (sVar23 == ssl_hs_ok) {
        hs->state = 0x14;
        goto LAB_00145655;
      }
      break;
    case 5:
      pSVar43 = hs->ssl;
      bVar14 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      if (!bVar14) {
LAB_00145442:
        hs->state = 6;
        goto LAB_00145655;
      }
      bVar14 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_168);
      sVar23 = ssl_hs_read_message;
      if (bVar14) {
        bVar14 = ssl_check_message_type(pSVar43,(SSLMessage *)local_168,0xb);
        sVar23 = ssl_hs_error;
        if ((bVar14) &&
           (bVar14 = ssl_hash_message(hs,(SSLMessage *)local_168), pUVar45 = local_2f0, bVar14)) {
          local_208._8_8_ = CONCAT62(local_168._18_6_,local_168._16_2_);
          local_208._0_8_ = local_168._8_8_;
          local_2d8[0] = 0x32;
          in_R9 = (SSL_SESSION *)
                  ((pSVar43->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->pool;
          in_R8 = (SSL_SESSION *)local_208;
          bVar14 = ssl_parse_cert_chain
                             (local_2d8,
                              &((local_2f0->_M_t).
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs,
                              local_268,(uint8_t *)0x0,(CBS *)in_R8,(CRYPTO_BUFFER_POOL *)in_R9);
          if (bVar14) {
            sVar33 = OPENSSL_sk_num((OPENSSL_STACK *)
                                    (((pUVar45->_M_t).
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)
                                    ->certs)._M_t.
                                    super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                   );
            if (((sVar33 == 0) || ((pointer)local_208._8_8_ != (pointer)0x0)) ||
               (bVar14 = (*((pSVar43->ctx)._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                           session_cache_objects)
                                   ((pUVar45->_M_t).
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl),
               !bVar14)) {
              in_R8 = (SSL_SESSION *)0x35f;
LAB_00146a9d:
              ERR_put_error(0x10,0,0x89,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,(int)in_R8);
LAB_00146aa5:
              iVar24 = 0x32;
              goto LAB_00146aaf;
            }
            pkey = (hs->peer_pubkey)._M_t.
                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
            pCVar30 = (CRYPTO_BUFFER *)
                      OPENSSL_sk_value((OPENSSL_STACK *)
                                       (((hs->new_session)._M_t.
                                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                        _M_head_impl)->certs)._M_t.
                                       super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                       ,0);
            bVar14 = ssl_check_leaf_certificate(hs,pkey,pCVar30);
            if (bVar14) {
              (*pSVar43->method->next_message)(pSVar43);
              goto LAB_00145442;
            }
            uVar29 = 0x2f;
          }
          else {
            uVar29 = (uint)local_2d8[0];
          }
          goto LAB_00146a74;
        }
      }
      break;
    case 6:
      if ((hs->field_0x6c8 & 0x40) != 0) {
        pSVar43 = hs->ssl;
        bVar14 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_168);
        sVar23 = ssl_hs_read_message;
        if (!bVar14) break;
        if (local_168[1] == '\x16') {
          bVar14 = ssl_hash_message(hs,(SSLMessage *)local_168);
          sVar23 = ssl_hs_error;
          if (!bVar14) break;
          local_208._8_8_ = CONCAT62(local_168._18_6_,local_168._16_2_);
          local_208._0_8_ = local_168._8_8_;
          iVar24 = CBS_get_u8((CBS *)local_208,local_238);
          if ((((iVar24 == 0) || (local_238[0] != (bssl)0x1)) ||
              (iVar24 = CBS_get_u24_length_prefixed((CBS *)local_208,(CBS *)local_2d8),
              pUVar45 = local_2f0, iVar24 == 0)) ||
             (((SSL_CONFIG *)auStack_2d0._0_8_ == (SSL_CONFIG *)0x0 ||
              ((pointer)local_208._8_8_ != (pointer)0x0)))) {
            in_R8 = (SSL_SESSION *)0x390;
            goto LAB_00146a9d;
          }
          psVar37 = (local_2f0->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                    ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          pCVar30 = CRYPTO_BUFFER_new_from_CBS
                              ((CBS *)local_2d8,
                               ((pSVar43->ctx)._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->pool);
          std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                     &psVar37->ocsp_response,pCVar30);
          if ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
              *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
               &(((pUVar45->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ocsp_response)._M_t.
                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> ==
              (crypto_buffer_st *)0x0) {
LAB_00146c2e:
            uVar29 = 0x50;
            goto LAB_00146a74;
          }
          (*pSVar43->method->next_message)(pSVar43);
        }
      }
      hs->state = 7;
      goto LAB_00145655;
    case 7:
      bVar14 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      sVar39 = ssl_hs_ok;
      iVar24 = 9;
      if (bVar14) {
        sVar22 = ssl_verify_peer_cert(hs);
        sVar23 = ssl_hs_error;
        if (sVar22 == ssl_verify_invalid) break;
        if (sVar22 == ssl_verify_retry) {
          sVar39 = ssl_hs_certificate_verify;
          iVar24 = 7;
        }
      }
      hs->state = iVar24;
      sVar23 = sVar39;
      break;
    case 8:
      if (((hs->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->reverify_on_resume == false) {
        __assert_fail("hs->ssl->ctx->reverify_on_resume",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                      ,0x3b7,
                      "enum ssl_hs_wait_t bssl::do_reverify_server_certificate(SSL_HANDSHAKE *)");
      }
      sVar22 = ssl_reverify_peer_cert(hs,true);
      sVar23 = ssl_hs_error;
      if (sVar22 != ssl_verify_invalid) {
        if (sVar22 == ssl_verify_retry) {
          sVar23 = ssl_hs_certificate_verify;
          iVar24 = 8;
        }
        else {
          sVar23 = ssl_hs_ok;
          iVar24 = 0x11;
        }
        hs->state = iVar24;
      }
      break;
    case 9:
      pSVar43 = hs->ssl;
      bVar14 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_208);
      sVar23 = ssl_hs_read_message;
      if (bVar14) {
        if (local_208[1] == '\f') {
          bVar14 = ssl_hash_message(hs,(SSLMessage *)local_208);
          sVar23 = ssl_hs_error;
          if (!bVar14) break;
          uVar29 = hs->new_cipher->algorithm_mkey;
          uVar26 = hs->new_cipher->algorithm_auth;
          local_2d8 = (undefined1  [8])local_208._8_8_;
          auStack_2d0._0_8_ = local_208._16_8_;
          if ((uVar26 & 8) == 0) {
LAB_00144f56:
            if ((uVar29 & 2) == 0) {
              if ((uVar29 & 4) == 0) {
                in_R8 = (SSL_SESSION *)0x423;
                goto LAB_00145e35;
              }
            }
            else {
              iVar24 = CBS_get_u8((CBS *)local_2d8,local_298);
              if ((((iVar24 == 0) || (local_298[0] != '\x03')) ||
                  (iVar24 = CBS_get_u16((CBS *)local_2d8,(uint16_t *)local_238), iVar24 == 0)) ||
                 (iVar24 = CBS_get_u8_length_prefixed((CBS *)local_2d8,(CBS *)local_168),
                 iVar24 == 0)) {
                in_R8 = (SSL_SESSION *)0x411;
                goto LAB_00146a62;
              }
              bVar14 = tls1_check_group_id(hs,CONCAT11(local_238[1],local_238[0]));
              uVar10 = local_168._8_8_;
              uVar9 = local_168._0_8_;
              if (!bVar14) {
                in_R8 = (SSL_SESSION *)0x418;
                ERR_put_error(0x10,0,0xf3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x418);
                uVar29 = 0x2f;
                goto LAB_00146a74;
              }
              ((local_2f0->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
               .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->group_id =
                   CONCAT11(local_238[1],local_238[0]);
              bVar14 = Array<unsigned_char>::InitUninitialized(local_260,local_168._8_8_);
              if ((SSL_CONFIG *)uVar10 != (SSL_CONFIG *)0x0 && bVar14) {
                memmove(local_260->data_,(void *)uVar9,uVar10);
              }
              sVar23 = ssl_hs_error;
              if (!bVar14) break;
            }
            uVar9 = local_208._8_8_;
            sVar33 = local_208._16_8_ - auStack_2d0._0_8_;
            bVar14 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
            if (!bVar14) {
              if (uVar26 != 8) {
                __assert_fail("alg_a == SSL_aPSK",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x468,
                              "enum ssl_hs_wait_t bssl::do_read_server_key_exchange(SSL_HANDSHAKE *)"
                             );
              }
              if ((SSL_CONFIG *)auStack_2d0._0_8_ == (SSL_CONFIG *)0x0) {
LAB_00147553:
                (*pSVar43->method->next_message)(pSVar43);
                goto LAB_0014755d;
              }
              iVar24 = 0x97;
              in_R8 = (SSL_SESSION *)0x46b;
LAB_001476d3:
              ERR_put_error(0x10,0,iVar24,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,(int)in_R8);
              goto LAB_00146aa5;
            }
            local_2e8._0_1_ = 0;
            local_2e8._1_1_ = 0;
            uVar17 = ssl_protocol_version(pSVar43);
            if (uVar17 < 0x303) {
              bVar14 = tls1_get_legacy_signature_algorithm
                                 ((uint16_t *)&local_2e8,
                                  (local_268->_M_t).
                                  super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
              if (bVar14) {
LAB_00147441:
                iVar24 = CBS_get_u16_length_prefixed((CBS *)local_2d8,(CBS *)local_238);
                if ((iVar24 != 0) && ((SSL_CONFIG *)auStack_2d0._0_8_ == (SSL_CONFIG *)0x0)) {
                  CBB_zero((CBB *)local_168);
                  local_298 = (undefined1  [8])0x0;
                  pSStack_290 = (SSL_SESSION *)0x0;
                  iVar24 = CBB_init((CBB *)local_168,sVar33 + 0x40);
                  if ((((iVar24 == 0) ||
                       ((iVar24 = CBB_add_bytes((CBB *)local_168,pSVar43->s3->client_random,0x20),
                        iVar24 == 0 ||
                        (iVar24 = CBB_add_bytes((CBB *)local_168,pSVar43->s3->server_random,0x20),
                        iVar24 == 0)))) ||
                      (iVar24 = CBB_add_bytes((CBB *)local_168,(uint8_t *)uVar9,sVar33), iVar24 == 0
                      )) || (bVar14 = CBBFinishArray((CBB *)local_168,
                                                     (Array<unsigned_char> *)local_298), !bVar14)) {
                    iVar24 = 0x50;
                    in_R8 = (SSL_SESSION *)0x45a;
                    ERR_put_error(0x10,0,0x44,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                  ,0x45a);
                  }
                  else {
                    signature.data_._1_1_ = local_238[1];
                    signature.data_._0_1_ = local_238[0];
                    signature.data_._2_6_ = local_238._2_6_;
                    signature.size_ = local_238._8_8_;
                    in_R8 = (SSL_SESSION *)
                            (local_268->_M_t).
                            super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
                    local_308.data._0_1_ = local_298[0];
                    local_308.data._1_7_ = local_298._1_7_;
                    local_308.len = (size_t)pSStack_290;
                    in_stack_fffffffffffffce8 = local_298._0_4_;
                    in_stack_fffffffffffffcec = local_298._4_4_;
                    in_00.size_ = (size_t)pSStack_290;
                    in_00.data_ = (uchar *)local_298;
                    in_stack_fffffffffffffcf0 = pSStack_290;
                    bVar14 = ssl_public_key_verify
                                       (pSVar43,signature,CONCAT11(local_2e8._1_1_,(byte)local_2e8),
                                        (EVP_PKEY *)in_R8,in_00);
                    if (bVar14) {
                      Array<unsigned_char>::~Array((Array<unsigned_char> *)local_298);
                      CBB_cleanup((CBB *)local_168);
                      goto LAB_00147553;
                    }
                    iVar24 = 0x33;
                    in_R8 = (SSL_SESSION *)0x462;
                    ERR_put_error(0x10,0,0x72,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                  ,0x462);
                  }
                  ssl_send_alert(pSVar43,2,iVar24);
                  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_298);
                  CBB_cleanup((CBB *)local_168);
                  goto LAB_00146a79;
                }
                iVar24 = 0x89;
                in_R8 = (SSL_SESSION *)0x44a;
                goto LAB_001476d3;
              }
              in_R8 = (SSL_SESSION *)0x441;
              ERR_put_error(0x10,0,0xc1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x441);
              uVar29 = 0x2b;
            }
            else {
              iVar24 = CBS_get_u16((CBS *)local_2d8,(uint16_t *)&local_2e8);
              if (iVar24 == 0) {
                in_R8 = (SSL_SESSION *)0x434;
                ERR_put_error(0x10,0,0x89,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x434);
                uVar29 = 0x32;
              }
              else {
                local_168[0] = (bssl)0x32;
                bVar14 = tls12_check_peer_sigalg
                                   (hs,local_168,CONCAT11(local_2e8._1_1_,(byte)local_2e8),
                                    (hs->peer_pubkey)._M_t.
                                    super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
                if (bVar14) {
                  ((local_2f0->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                  peer_signature_algorithm = CONCAT11(local_2e8._1_1_,(byte)local_2e8);
                  goto LAB_00147441;
                }
                uVar29 = (uint)(byte)local_168[0];
              }
            }
          }
          else {
            iVar24 = CBS_get_u16_length_prefixed((CBS *)local_2d8,(CBS *)local_168);
            if (iVar24 != 0) {
              if (((SSL_CONFIG *)0x80 < (ulong)local_168._8_8_) ||
                 (iVar24 = CBS_contains_zero_byte((CBS *)local_168), iVar24 != 0)) {
                in_R8 = (SSL_SESSION *)0x3f5;
                ERR_put_error(0x10,0,0x88,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x3f5);
                uVar29 = 0x28;
                goto LAB_00146a74;
              }
              local_238[0] = (bssl)0x0;
              local_238[1] = '\0';
              local_238._2_6_ = 0;
              if ((SSL_CONFIG *)local_168._8_8_ == (SSL_CONFIG *)0x0) {
                __p_03 = (pointer)0x0;
              }
              else {
                iVar24 = CBS_strdup((CBS *)local_168,(char **)local_238);
                if (iVar24 == 0) goto LAB_00146c2e;
                __p_03 = (pointer)CONCAT62(local_238._2_6_,CONCAT11(local_238[1],local_238[0]));
              }
              std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)local_170._M_head_impl,
                         __p_03);
              goto LAB_00144f56;
            }
            in_R8 = (SSL_SESSION *)0x3e7;
LAB_00146a62:
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,(int)in_R8);
            uVar29 = 0x32;
          }
LAB_00146a74:
          ssl_send_alert(pSVar43,2,uVar29);
LAB_00146a79:
          sVar23 = ssl_hs_error;
        }
        else {
          bVar14 = ssl_cipher_requires_server_key_exchange(hs->new_cipher);
          if (!bVar14) {
LAB_0014755d:
            hs->state = 10;
            goto LAB_00145655;
          }
          in_R8 = (SSL_SESSION *)0x3d1;
LAB_00145e35:
          ERR_put_error(0x10,0,0xdf,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,(int)in_R8);
          iVar24 = 10;
LAB_00146aaf:
          ssl_send_alert(pSVar43,2,iVar24);
          sVar23 = ssl_hs_error;
        }
      }
      break;
    case 10:
      pSVar43 = hs->ssl;
      bVar14 = ssl_cipher_uses_certificate_auth(hs->new_cipher);
      if (!bVar14) {
LAB_001455c9:
        hs->state = 0xb;
        goto LAB_00145655;
      }
      bVar14 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_168);
      sVar23 = ssl_hs_read_message;
      if (bVar14) {
        if (local_168[1] == '\x0e') {
          SSLTranscript::FreeBuffer(local_2a0);
          goto LAB_001455c9;
        }
        bVar14 = ssl_check_message_type(pSVar43,(SSLMessage *)local_168,0xd);
        sVar23 = ssl_hs_error;
        if ((bVar14) && (bVar14 = ssl_hash_message(hs,(SSLMessage *)local_168), bVar14)) {
          local_208._8_8_ = CONCAT62(local_168._18_6_,local_168._16_2_);
          local_208._0_8_ = local_168._8_8_;
          iVar24 = CBS_get_u8_length_prefixed((CBS *)local_208,(CBS *)local_2d8);
          uVar9 = auStack_2d0._0_8_;
          auVar12 = local_2d8;
          if (iVar24 == 0) {
            ssl_send_alert(pSVar43,2,0x32);
            iVar24 = 0x89;
            in_R8 = (SSL_SESSION *)0x494;
          }
          else {
            bVar14 = Array<unsigned_char>::InitUninitialized(local_180,auStack_2d0._0_8_);
            if ((SSL_CONFIG *)uVar9 != (SSL_CONFIG *)0x0 && bVar14) {
              memmove(local_180->data_,(void *)auVar12,uVar9);
            }
            if (!bVar14) goto LAB_00146c2e;
            uVar17 = ssl_protocol_version(pSVar43);
            if ((uVar17 < 0x303) ||
               ((iVar24 = CBS_get_u16_length_prefixed((CBS *)local_208,(CBS *)local_238),
                iVar24 != 0 && (bVar14 = tls1_parse_peer_sigalgs(hs,(CBS *)local_238), bVar14)))) {
              local_298[0] = 0x32;
              SSL_parse_CA_list((bssl *)local_238,pSVar43,local_298,(CBS *)local_208);
              __p_01 = (pointer)CONCAT62(local_238._2_6_,CONCAT11(local_238[1],local_238[0]));
              if (__p_01 == (pointer)0x0) {
                sVar23 = ssl_hs_error;
                ssl_send_alert(pSVar43,2,(uint)local_298[0]);
              }
              else if ((pointer)local_208._8_8_ == (pointer)0x0) {
                hs->field_0x6c8 = hs->field_0x6c8 | 0x20;
                local_238[0] = (bssl)0x0;
                local_238[1] = '\0';
                local_238._2_6_ = 0;
                std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                           local_60._M_head_impl,__p_01);
                (*((pSVar43->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                  hs_flush_cached_ca_names)(hs);
                (*pSVar43->method->next_message)(pSVar43);
                hs->state = 0xb;
                sVar23 = ssl_hs_ok;
              }
              else {
                ssl_send_alert(pSVar43,2,0x32);
                sVar23 = ssl_hs_error;
                in_R8 = (SSL_SESSION *)0x4b1;
                ERR_put_error(0x10,0,0x89,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x4b1);
              }
              std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)local_238);
              break;
            }
            ssl_send_alert(pSVar43,2,0x32);
            iVar24 = 0x89;
            in_R8 = (SSL_SESSION *)0x4a2;
          }
LAB_00147624:
          ERR_put_error(0x10,0,iVar24,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,(int)in_R8);
          sVar23 = ssl_hs_error;
        }
      }
      break;
    case 0xb:
      pSVar43 = hs->ssl;
      bVar14 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_168);
      sVar23 = ssl_hs_read_message;
      if (bVar14) {
        bVar14 = ssl_check_message_type(pSVar43,(SSLMessage *)local_168,0xe);
        sVar23 = ssl_hs_error;
        if ((bVar14) && (bVar14 = ssl_hash_message(hs,(SSLMessage *)local_168), bVar14)) {
          if (CONCAT62(local_168._18_6_,local_168._16_2_) == 0) {
            bVar14 = (*pSVar43->method->has_unprocessed_handshake_data)(pSVar43);
            if (!bVar14) {
              (*pSVar43->method->next_message)(pSVar43);
              hs->state = 0xc;
              goto LAB_00145655;
            }
            ssl_send_alert(pSVar43,2,10);
            iVar24 = 0xff;
            in_R8 = (SSL_SESSION *)0x4d4;
          }
          else {
            ssl_send_alert(pSVar43,2,0x32);
            iVar24 = 0x89;
            in_R8 = (SSL_SESSION *)0x4cd;
          }
          goto LAB_00147624;
        }
      }
      break;
    case 0xc:
      if ((hs->field_0x6c8 & 0x20) != 0) {
        pSVar43 = hs->ssl;
        if (pSVar43->s3->ech_status == ssl_ech_rejected) {
          local_2e0 = uVar32;
          SSL_certs_clear(pSVar43);
        }
        else {
          pCVar5 = (hs->config->cert)._M_t.
                   super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
          p_Var6 = pCVar5->cert_cb;
          local_2e0 = uVar32;
          if (p_Var6 != (_func_int_SSL_ptr_void_ptr *)0x0) {
            iVar24 = (*p_Var6)(pSVar43,pCVar5->cert_cb_arg);
            if (iVar24 == 0) {
              ssl_send_alert(pSVar43,2,0x50);
              iVar24 = 0x7e;
              in_R8 = (SSL_SESSION *)0x512;
              goto LAB_00145302;
            }
            if (iVar24 < 0) {
              hs->state = 0xc;
              sVar23 = ssl_hs_x509_lookup;
              goto LAB_00146e45;
            }
          }
        }
        local_168._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
        local_168._8_8_ = (SSL_CONFIG *)0x0;
        bVar14 = ssl_get_full_credential_list(hs,(Array<ssl_credential_st_*> *)local_168);
        uVar9 = local_168._0_8_;
        sVar23 = ssl_hs_error;
        if (bVar14) {
          if ((SSL_CONFIG *)local_168._8_8_ == (SSL_CONFIG *)0x0) {
            SSLTranscript::FreeBuffer(local_2a0);
          }
          else {
            lVar41 = local_168._8_8_ << 3;
            lVar46 = 0;
            local_2a8 = pSVar43;
            do {
              cred = *(SSL_CREDENTIAL **)
                      (((InplaceVector<unsigned_char,_64UL> *)(uVar9 + 10))->storage_ + lVar46 + -10
                      );
              ERR_clear_error();
              if (cred->type == kX509) {
                iVar24 = EVP_PKEY_id((EVP_PKEY *)
                                     (cred->pubkey)._M_t.
                                     super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
                if (iVar24 == 6) {
                  uVar15 = 1;
LAB_00145d3f:
                  local_208[0] = uVar15;
                  puVar31 = (hs->certificate_types).data_;
                  puVar31 = std::
                            __find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                                      (puVar31,puVar31 + (hs->certificate_types).size_,local_208);
                  if (puVar31 != (hs->certificate_types).data_ + (hs->certificate_types).size_) {
                    bVar14 = tls1_choose_signature_algorithm(hs,cred,(uint16_t *)local_2d8);
                    if ((!bVar14) ||
                       (bVar14 = ssl_credential_matches_requested_issuers(hs,cred), !bVar14))
                    goto LAB_00145dbd;
                    SSL_CREDENTIAL_up_ref(cred);
                    local_208._0_8_ =
                         (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0;
                    std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)
                               local_248,cred);
                    std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)local_208);
                    hs->signature_algorithm = local_2d8._0_2_;
                    break;
                  }
                  in_R8 = (SSL_SESSION *)0x4f4;
                }
                else if ((iVar24 == 0x3b5) || (in_R8 = (SSL_SESSION *)0x4ef, iVar24 == 0x198)) {
                  uVar15 = 0x40;
                  goto LAB_00145d3f;
                }
                ERR_put_error(0x10,0,0xe4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,(int)in_R8);
              }
              else {
                in_R8 = (SSL_SESSION *)0x4e0;
                ERR_put_error(0x10,0,0xe4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x4e0);
              }
LAB_00145dbd:
              lVar46 = lVar46 + 8;
            } while (lVar41 != lVar46);
            pSVar43 = local_2a8;
            if ((local_248->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
                (ssl_credential_st *)0x0) {
              uVar32 = ERR_peek_error();
              if ((int)uVar32 == 0) {
                __assert_fail("ERR_peek_error() != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x531,
                              "enum ssl_hs_wait_t bssl::do_send_client_certificate(SSL_HANDSHAKE *)"
                             );
              }
              ssl_send_alert(pSVar43,2,0x28);
              goto LAB_001464e0;
            }
          }
          bVar14 = ssl_send_tls12_certificate(hs);
          if (bVar14) {
            hs->state = 0xd;
            sVar23 = ssl_hs_ok;
          }
        }
LAB_001464e0:
        OPENSSL_free((void *)local_168._0_8_);
        goto LAB_00146e45;
      }
      hs->state = 0xd;
LAB_00145655:
      sVar23 = ssl_hs_ok;
      break;
    case 0xd:
      pSVar43 = hs->ssl;
      CBB_zero((CBB *)local_2d8);
      bVar14 = (*pSVar43->method->init_message)(pSVar43,(CBB *)local_2d8,(CBB *)local_238,'\x10');
      sVar23 = ssl_hs_error;
      local_2e0 = uVar32;
      if (bVar14) {
        local_308.data._0_1_ = 0;
        local_308.data._1_7_ = 0;
        local_308.len = 0;
        pSVar35 = hs->new_cipher;
        uVar27 = pSVar35->algorithm_mkey;
        uVar29 = pSVar35->algorithm_auth;
        bVar14 = ssl_cipher_uses_certificate_auth(pSVar35);
        if (bVar14) {
          pCVar30 = (CRYPTO_BUFFER *)
                    OPENSSL_sk_value((OPENSSL_STACK *)
                                     (((local_2f0->_M_t).
                                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)
                                     ->certs)._M_t.
                                     super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                     ,0);
          CRYPTO_BUFFER_init_CBS(pCVar30,(CBS *)local_168);
          bVar14 = ssl_cert_check_key_usage((CBS *)local_168,uVar27 * 2 & key_usage_encipherment);
          if (bVar14) goto LAB_001454f0;
          if (((hs->config->field_0x10d & 0x10) == 0) &&
             (iVar24 = EVP_PKEY_id((EVP_PKEY *)
                                   (local_268->_M_t).
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl),
             iVar24 == 6)) {
            ERR_clear_error();
            puVar34 = &pSVar43->s3->field_0xdc;
            *(ushort *)puVar34 = *(ushort *)puVar34 | 0x2000;
            goto LAB_001454f0;
          }
LAB_00146e2e:
          sVar23 = ssl_hs_error;
        }
        else {
LAB_001454f0:
          local_2a8 = (SSL *)((ulong)local_2a8 & 0xffffffff00000000);
          if ((uVar29 & 8) == 0) {
LAB_00145502:
            if ((uVar27 & 1) == 0) {
              if ((uVar27 & 2) != 0) {
                iVar24 = CBB_add_u8_length_prefixed((CBB *)local_238,(CBB *)local_208);
                if (iVar24 == 0) goto LAB_00146e2e;
                SSLKeyShare::Create((SSLKeyShare *)local_298,
                                    ((local_2f0->_M_t).
                                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                    group_id);
                local_2e8._0_1_ = 0x32;
                if ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>)local_298 ==
                    (__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>)0x0) {
                  uVar27 = 0x32;
LAB_00146e14:
                  ssl_send_alert(pSVar43,2,uVar27);
                }
                else {
                  in_R8 = (SSL_SESSION *)(hs->peer_key).data_;
                  in_R9 = (SSL_SESSION *)(hs->peer_key).size_;
                  cVar16 = (**(code **)(*(_func_int **)local_298 + 0x20))
                                     (local_298,local_208,&local_308,&local_2e8);
                  if (cVar16 == '\0') {
                    uVar27 = (uint)(byte)local_2e8;
                    goto LAB_00146e14;
                  }
                  iVar24 = CBB_flush((CBB *)local_238);
                  if (iVar24 != 0) {
                    OPENSSL_free(local_260->data_);
                    local_260->data_ = (uchar *)0x0;
                    local_260->size_ = 0;
                    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)local_298);
                    goto LAB_001469af;
                  }
                }
                std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)local_298);
                goto LAB_00146e2e;
              }
              if ((uVar27 & 4) == 0) {
                ssl_send_alert(pSVar43,2,0x28);
                in_R8 = (SSL_SESSION *)0x5c2;
                iVar24 = 0x44;
                goto LAB_001464a2;
              }
              bVar14 = Array<unsigned_char>::Init
                                 ((Array<unsigned_char> *)&local_308,(ulong)local_2a8 & 0xffffffff);
              if (!bVar14) goto LAB_00146e2e;
LAB_001469af:
              if ((uVar29 & 8) != 0) {
                CBB_zero((CBB *)local_208);
                uVar32 = (ulong)local_2a8 & 0xffffffff;
                iVar24 = CBB_init((CBB *)local_208,
                                  (size_t)(((InplaceVector<unsigned_char,_64UL> *)
                                           (local_308.len + 10))->storage_ + (uVar32 - 6)));
                if ((((iVar24 == 0) ||
                     (iVar24 = CBB_add_u16_length_prefixed((CBB *)local_208,(CBB *)local_298),
                     iVar24 == 0)) ||
                    ((iVar24 = CBB_add_bytes((CBB *)local_298,
                                             (uint8_t *)
                                             CONCAT71(local_308.data._1_7_,(byte)local_308.data),
                                             local_308.len), iVar24 == 0 ||
                     ((iVar24 = CBB_add_u16_length_prefixed((CBB *)local_208,(CBB *)local_298),
                      iVar24 == 0 ||
                      (iVar24 = CBB_add_bytes((CBB *)local_298,local_168,uVar32), iVar24 == 0))))))
                   || (bVar14 = CBBFinishArray((CBB *)local_208,(Array<unsigned_char> *)&local_308),
                      !bVar14)) {
                  CBB_cleanup((CBB *)local_208);
                  goto LAB_00146e2e;
                }
                CBB_cleanup((CBB *)local_208);
              }
              bVar14 = ssl_add_message_cbb(pSVar43,(CBB *)local_2d8);
              sVar23 = ssl_hs_error;
              if (bVar14) {
                psVar37 = (hs->new_session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                (psVar37->secret).size_ = '0';
                out.data_ = &psVar37->secret;
                premaster.data_._1_7_ = local_308.data._1_7_;
                premaster.data_._0_1_ = (byte)local_308.data;
                premaster.size_ = local_308.len;
                out.size_ = 0x30;
                in_R8 = (SSL_SESSION *)local_308.len;
                bVar14 = tls1_generate_master_secret(hs,out,premaster);
                if (bVar14) {
                  psVar37 = (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                  psVar37->field_0x1b8 =
                       psVar37->field_0x1b8 & 0xfe | (byte)(*(uint *)&hs->field_0x6c8 >> 0x11) & 1;
                  hs->state = 0xe;
                  sVar23 = ssl_hs_ok;
                }
              }
            }
            else {
              rsa = EVP_PKEY_get0_RSA((local_268->_M_t).
                                      super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
              if (rsa == (RSA *)0x0) {
                sVar23 = ssl_hs_error;
                in_R8 = (SSL_SESSION *)0x58e;
                ERR_put_error(0x10,0,0x44,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x58e);
              }
              else {
                OPENSSL_free((void *)CONCAT71(local_308.data._1_7_,(byte)local_308.data));
                local_308.data._0_1_ = 0;
                local_308.data._1_7_ = 0;
                local_308.len = 0;
                puVar34 = (undefined1 *)OPENSSL_malloc(0x40);
                local_308.data._0_1_ = (byte)puVar34;
                local_308.data._1_7_ = (int7)((ulong)puVar34 >> 8);
                sVar23 = ssl_hs_error;
                if (puVar34 != (undefined1 *)0x0) {
                  local_308.len = 0x40;
                  *puVar34 = *(undefined1 *)((long)&hs->client_version + 1);
                  puVar34[1] = (char)hs->client_version;
                  iVar24 = RAND_bytes(puVar34 + 2,0x3e);
                  if ((iVar24 != 0) &&
                     (iVar24 = CBB_add_u16_length_prefixed((CBB *)local_238,(CBB *)local_208),
                     iVar24 != 0)) {
                    uVar27 = RSA_size((RSA *)rsa);
                    iVar24 = CBB_reserve((CBB *)local_208,(uint8_t **)local_298,(ulong)uVar27);
                    auVar12 = local_298;
                    if (iVar24 != 0) {
                      uVar27 = RSA_size((RSA *)rsa);
                      in_R8 = (SSL_SESSION *)CONCAT71(local_308.data._1_7_,(byte)local_308.data);
                      in_stack_fffffffffffffce8 = 1;
                      in_R9 = (SSL_SESSION *)local_308.len;
                      iVar24 = RSA_encrypt(rsa,&local_2e8,(uint8_t *)auVar12,(ulong)uVar27,
                                           (uint8_t *)in_R8,local_308.len,1);
                      if (((iVar24 != 0) &&
                          (iVar24 = CBB_did_write((CBB *)local_208,
                                                  CONCAT62(local_2e8._2_6_,
                                                           CONCAT11(local_2e8._1_1_,(byte)local_2e8)
                                                          )), iVar24 != 0)) &&
                         (iVar24 = CBB_flush((CBB *)local_238), iVar24 != 0)) goto LAB_001469af;
                    }
                  }
                }
              }
            }
          }
          else {
            pSVar7 = hs->config;
            if (pSVar7->psk_client_callback !=
                (_func_uint_SSL_ptr_char_ptr_char_ptr_uint_uint8_t_ptr_uint *)0x0) {
              memset(local_208,0,0x81);
              in_R8 = (SSL_SESSION *)local_168;
              in_R9 = (SSL_SESSION *)0x0;
              uVar26 = (*pSVar7->psk_client_callback)
                                 (pSVar43,(char *)*(
                                                  __uniq_ptr_data<char,_bssl::internal::Deleter,_true,_true>
                                                  *)local_170._M_head_impl,local_208,0x81,
                                  (uint8_t *)in_R8,0x100);
              local_2a8 = (SSL *)CONCAT44(local_2a8._4_4_,uVar26);
              if (uVar26 == 0) {
                in_R8 = (SSL_SESSION *)0x575;
                ERR_put_error(0x10,0,0xc3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x575);
                ssl_send_alert(pSVar43,2,0x28);
              }
              else {
                if (0x100 < uVar26) {
                  __assert_fail("psk_len <= PSK_MAX_PSK_LEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x579,
                                "enum ssl_hs_wait_t bssl::do_send_client_key_exchange(SSL_HANDSHAKE *)"
                               );
                }
                psVar37 = (local_2f0->_M_t).
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                __p_02 = OPENSSL_strdup(local_208);
                std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)&psVar37->psk_identity,
                           __p_02);
                if ((_Head_base<0UL,_char_*,_false>)
                    *(_Tuple_impl<0UL,_char_*,_bssl::internal::Deleter> *)
                     &(((local_2f0->_M_t).
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->psk_identity).
                      _M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter> != (char *)0x0) {
                  iVar24 = CBB_add_u16_length_prefixed((CBB *)local_238,(CBB *)local_298);
                  if (iVar24 != 0) {
                    sVar33 = OPENSSL_strnlen(local_208,0x81);
                    iVar24 = CBB_add_bytes((CBB *)local_298,local_208,sVar33);
                    if ((iVar24 != 0) && (iVar24 = CBB_flush((CBB *)local_238), iVar24 != 0))
                    goto LAB_00145502;
                  }
                }
              }
              goto LAB_00146e2e;
            }
            in_R8 = (SSL_SESSION *)0x56b;
            iVar24 = 0xc4;
LAB_001464a2:
            sVar23 = ssl_hs_error;
            ERR_put_error(0x10,0,iVar24,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,(int)in_R8);
          }
        }
        OPENSSL_free((void *)CONCAT71(local_308.data._1_7_,(byte)local_308.data));
      }
      CBB_cleanup((CBB *)local_2d8);
      goto LAB_00146e45;
    case 0xe:
      if (((hs->field_0x6c8 & 0x20) == 0) ||
         ((local_248->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl == (ssl_credential_st *)0x0
         )) {
        hs->state = 0xf;
        goto LAB_00145655;
      }
      pSVar43 = hs->ssl;
      CBB_zero((CBB *)local_168);
      bVar14 = (*pSVar43->method->init_message)(pSVar43,(CBB *)local_168,(CBB *)local_208,'\x0f');
      sVar23 = ssl_hs_error;
      if (bVar14) {
        if (hs->signature_algorithm == 0) {
          __assert_fail("hs->signature_algorithm != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,0x5f4,
                        "enum ssl_hs_wait_t bssl::do_send_client_certificate_verify(SSL_HANDSHAKE *)"
                       );
        }
        uVar17 = ssl_protocol_version(pSVar43);
        if ((uVar17 < 0x303) ||
           (iVar24 = CBB_add_u16((CBB *)local_208,hs->signature_algorithm), iVar24 != 0)) {
          iVar24 = EVP_PKEY_size((EVP_PKEY *)
                                 (((local_248->_M_t).
                                   super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl)
                                 ->pubkey)._M_t.
                                 super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>);
          iVar20 = CBB_add_u16_length_prefixed((CBB *)local_208,(CBB *)local_2d8);
          sVar23 = ssl_hs_error;
          if (iVar20 != 0) {
            iVar20 = CBB_reserve((CBB *)local_2d8,(uint8_t **)local_298,(long)iVar24);
            if (iVar20 != 0) {
              local_308.data._0_1_ = (byte)iVar24;
              local_308.data._1_7_ = (int7)(int3)((uint)iVar24 >> 8);
              in_R8 = (SSL_SESSION *)(ulong)hs->signature_algorithm;
              _Var3._M_head_impl =
                   (hs->transcript).buffer_._M_t.
                   super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
              in_stack_fffffffffffffcf0 = (SSL_SESSION *)(_Var3._M_head_impl)->length;
              puVar31 = (uchar *)(_Var3._M_head_impl)->data;
              local_238[0] = SUB81(puVar31,0);
              local_238[1] = (char)((ulong)puVar31 >> 8);
              local_238._2_6_ = (undefined6)((ulong)puVar31 >> 0x10);
              in_stack_fffffffffffffce8 = SUB84(puVar31,0);
              in_stack_fffffffffffffcec = (undefined4)((ulong)puVar31 >> 0x20);
              in.size_ = (size_t)in_stack_fffffffffffffcf0;
              in.data_ = puVar31;
              local_238._8_8_ = in_stack_fffffffffffffcf0;
              sVar21 = ssl_private_key_sign
                                 (hs,(uint8_t *)local_298,(size_t *)&local_308,(long)iVar24,
                                  hs->signature_algorithm,in);
              if (sVar21 == ssl_private_key_retry) {
                sVar23 = ssl_hs_private_key_operation;
                iVar24 = 0xe;
              }
              else {
                sVar23 = ssl_hs_error;
                if (((sVar21 == ssl_private_key_failure) ||
                    (iVar24 = CBB_did_write((CBB *)local_2d8,
                                            CONCAT71(local_308.data._1_7_,(byte)local_308.data)),
                    iVar24 == 0)) ||
                   (bVar14 = ssl_add_message_cbb(pSVar43,(CBB *)local_168), !bVar14))
                goto LAB_00146c1e;
                SSLTranscript::FreeBuffer(local_2a0);
                sVar23 = ssl_hs_ok;
                iVar24 = 0xf;
              }
              hs->state = iVar24;
            }
          }
        }
        else {
          sVar23 = ssl_hs_error;
          in_R8 = (SSL_SESSION *)0x5f8;
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,0x5f8);
        }
      }
LAB_00146c1e:
      CBB_cleanup((CBB *)local_168);
      break;
    case 0xf:
      pSVar43 = hs->ssl;
      hs->field_0x6ca = hs->field_0x6ca | 0x80;
      bVar14 = (*pSVar43->method->add_change_cipher_spec)(pSVar43);
      sVar23 = ssl_hs_error;
      if (bVar14) {
        bVar14 = tls1_change_cipher_state(hs,evp_aead_seal);
        sVar23 = ssl_hs_error;
        if (bVar14) {
          uVar29 = *(uint *)&hs->field_0x6c8;
          if ((short)uVar29 < 0) {
            sVar33 = (pSVar43->s3->next_proto_negotiated).size_;
            CBB_zero((CBB *)local_168);
            bVar14 = (*pSVar43->method->init_message)(pSVar43,(CBB *)local_168,(CBB *)local_208,'C')
            ;
            if (((((!bVar14) ||
                  (iVar24 = CBB_add_u8_length_prefixed((CBB *)local_208,(CBB *)local_2d8),
                  iVar24 == 0)) ||
                 (iVar24 = CBB_add_bytes((CBB *)local_2d8,(pSVar43->s3->next_proto_negotiated).data_
                                         ,(pSVar43->s3->next_proto_negotiated).size_), iVar24 == 0))
                || ((iVar24 = CBB_add_u8_length_prefixed((CBB *)local_208,(CBB *)local_2d8),
                    iVar24 == 0 ||
                    (iVar24 = CBB_add_bytes((CBB *)local_2d8,
                                            do_send_client_finished(bssl::SSL_HANDSHAKE*)::kZero,
                                            0x20 - (ulong)((int)sVar33 + 2U & 0x1f)), iVar24 == 0)))
                ) || (bVar14 = ssl_add_message_cbb(pSVar43,(CBB *)local_168), !bVar14)) {
              in_R8 = (SSL_SESSION *)0x634;
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x634);
              CBB_cleanup((CBB *)local_168);
              goto LAB_00146a79;
            }
            CBB_cleanup((CBB *)local_168);
            uVar29 = *(uint *)&hs->field_0x6c8;
          }
          if ((uVar29 >> 0x18 & 1) != 0) {
            CBB_zero((CBB *)local_168);
            bVar14 = (*pSVar43->method->init_message)
                               (pSVar43,(CBB *)local_168,(CBB *)local_208,0xcb);
            if (((!bVar14) || (bVar14 = tls1_write_channel_id(hs,(CBB *)local_208), !bVar14)) ||
               (bVar14 = ssl_add_message_cbb(pSVar43,(CBB *)local_168), !bVar14)) {
              in_R8 = (SSL_SESSION *)0x63f;
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0x63f);
              CBB_cleanup((CBB *)local_168);
              goto LAB_00146a79;
            }
            CBB_cleanup((CBB *)local_168);
          }
          bVar14 = ssl_send_finished(hs);
          sVar23 = ssl_hs_error;
          if (bVar14) {
            hs->state = 0x10;
LAB_0014504c:
            sVar23 = ssl_hs_flush;
          }
        }
      }
      break;
    case 0x10:
      pSVar43 = hs->ssl;
      if ((pSVar43->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
          _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl == (ssl_session_st *)0x0) {
        bVar14 = tls1_record_handshake_hashes_for_channel_id(hs);
        sVar23 = ssl_hs_error;
        if (bVar14) {
          hs->state = 0x11;
          uVar25 = SSL_get_mode(pSVar43);
          sVar23 = ssl_hs_ok;
          if ((char)uVar25 < '\0') {
            pSVar44 = (SSL *)hs->ssl;
            iVar24 = SSL_is_dtls((SSL *)pSVar44);
            if (((((iVar24 == 0) && (iVar24 = SSL_version(pSVar44), iVar24 == 0x303)) &&
                 (hs->new_cipher->algorithm_mkey == 2)) &&
                (((hs->new_cipher->algorithm_mac == 4 &&
                  (p_Var4 = pSVar44->handshake_func, *(int *)(p_Var4 + 0xd8) != 2)) &&
                 (((pSVar44->packet[0x289] & 1) != 0 ||
                  ((*(long *)(p_Var4 + 0x220) != 0 || (*(long *)(p_Var4 + 0x210) != 0)))))))) &&
               (sVar23 = ssl_hs_ok, (pSVar43->s3->field_0xdc & 0x10) == 0)) {
              hs->field_0x6c9 = hs->field_0x6c9 | 0x22;
              sVar23 = ssl_hs_early_return;
            }
          }
        }
      }
      else {
        hs->state = 0x14;
LAB_00144c76:
        sVar23 = ssl_hs_ok;
      }
      break;
    case 0x11:
      if ((hs->field_0x6ca & 1) == 0) {
LAB_001452a2:
        hs->state = 0x12;
        sVar23 = ssl_hs_read_change_cipher_spec;
      }
      else {
        pSVar43 = hs->ssl;
        bVar14 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_168);
        sVar23 = ssl_hs_read_message;
        if (bVar14) {
          bVar14 = ssl_check_message_type(pSVar43,(SSLMessage *)local_168,4);
          sVar23 = ssl_hs_error;
          if ((bVar14) && (bVar14 = ssl_hash_message(hs,(SSLMessage *)local_168), bVar14)) {
            local_208._8_8_ = CONCAT62(local_168._18_6_,local_168._16_2_);
            local_208._0_8_ = local_168._8_8_;
            iVar24 = CBS_get_u32((CBS *)local_208,(uint32_t *)local_298);
            if ((iVar24 == 0) ||
               ((iVar24 = CBS_get_u16_length_prefixed((CBS *)local_208,(CBS *)local_2d8),
                iVar24 == 0 || ((pointer)local_208._8_8_ != (pointer)0x0)))) {
              ssl_send_alert(pSVar43,2,0x32);
              iVar24 = 0x89;
              in_R8 = (SSL_SESSION *)0x6a7;
              goto LAB_00147624;
            }
            if ((SSL_CONFIG *)auStack_2d0._0_8_ == (SSL_CONFIG *)0x0) {
              hs->field_0x6ca = hs->field_0x6ca & 0xfe;
            }
            else {
              pSVar38 = (pSVar43->session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              pSVar42 = (local_2f0->_M_t).
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              pUVar45 = local_2f0;
              if (pSVar38 != (SSL_SESSION *)0x0) {
                if (pSVar42 != (SSL_SESSION *)0x0) {
                  __assert_fail("!hs->new_session",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                                ,0x6b9,
                                "enum ssl_hs_wait_t bssl::do_read_session_ticket(SSL_HANDSHAKE *)");
                }
                SSL_SESSION_dup((bssl *)local_238,pSVar38,2);
                pUVar45 = local_2f0;
                __p_00 = (pointer)CONCAT62(local_238._2_6_,CONCAT11(local_238[1],local_238[0]));
                local_238[0] = (bssl)0x0;
                local_238[1] = '\0';
                local_238._2_6_ = 0;
                std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_2f0,
                           __p_00);
                std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_238);
                pSVar42 = (pUVar45->_M_t).
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                if (pSVar42 == (SSL_SESSION *)0x0) goto LAB_00146a79;
              }
              ssl_session_rebase_time(pSVar43,pSVar42);
              uVar9 = auStack_2d0._0_8_;
              auVar12 = local_2d8;
              this = &((pUVar45->_M_t).
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ticket;
              bVar14 = Array<unsigned_char>::InitUninitialized(this,auStack_2d0._0_8_);
              if ((SSL_CONFIG *)uVar9 != (SSL_CONFIG *)0x0 && bVar14) {
                memmove(this->data_,(void *)auVar12,uVar9);
              }
              if (!bVar14) goto LAB_00146a79;
              psVar37 = (hs->new_session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              psVar37->ticket_lifetime_hint = local_298._0_4_;
              (psVar37->session_id).size_ = ' ';
              SHA256((uchar *)local_2d8,auStack_2d0._0_8_,(uchar *)&psVar37->session_id);
            }
            (*pSVar43->method->next_message)(pSVar43);
            goto LAB_001452a2;
          }
        }
      }
      break;
    case 0x12:
      bVar14 = tls1_change_cipher_state(hs,evp_aead_open);
      sVar23 = ssl_hs_error;
      if (bVar14) {
        hs->state = 0x13;
        goto LAB_00145655;
      }
      break;
    case 0x13:
      pSVar43 = hs->ssl;
      sVar23 = ssl_get_finished(hs);
      if (sVar23 == ssl_hs_ok) {
        iVar24 = (uint)((pSVar43->session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
                       (ssl_session_st *)0x0) * 5 + 0xf;
        goto LAB_00145641;
      }
      break;
    case 0x14:
      pSVar43 = hs->ssl;
      if (pSVar43->s3->ech_status == ssl_ech_rejected) {
        hs->field_0x6c8 = hs->field_0x6c8 | 2;
        local_2e0 = uVar32;
        ssl_send_alert(pSVar43,2,0x79);
        iVar24 = 0x13f;
        in_R8 = (SSL_SESSION *)0x6f3;
LAB_00145302:
        sVar23 = ssl_hs_error;
        ERR_put_error(0x10,0,iVar24,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                      ,(int)in_R8);
      }
      else {
        local_2e0 = uVar32;
        (*pSVar43->method->on_handshake_complete)(pSVar43);
        pSVar38 = (local_2f0->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        if (pSVar38 == (SSL_SESSION *)0x0) {
          pSVar42 = (pSVar43->session)._M_t.
                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          if (pSVar42 == (SSL_SESSION *)0x0) {
            __assert_fail("ssl->session != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                          ,0x70e,
                          "enum ssl_hs_wait_t bssl::do_finish_client_handshake(SSL_HANDSHAKE *)");
          }
          SSL_SESSION_up_ref(pSVar42);
          local_168._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                     &pSVar43->s3->established_session,pSVar42);
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_168);
        }
        else {
          SSL_SESSION_dup((bssl *)local_168,pSVar38,3);
          uVar9 = local_168._0_8_;
          local_168._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                     &pSVar43->s3->established_session,(pointer)uVar9);
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_168);
          psVar37 = (pSVar43->s3->established_session)._M_t.
                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          uVar27 = (uint)local_2e0;
          sVar23 = ssl_hs_error;
          if (psVar37 == (ssl_session_st *)0x0) break;
          if ((pSVar43->s3->field_0xdc & 0x10) == 0) {
            puVar34 = &psVar37->field_0x1b8;
            *puVar34 = *puVar34 & 0xfb;
          }
          std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_2f0,
                     (pointer)0x0);
        }
        hs->field_0x6c8 = hs->field_0x6c8 | 8;
        puVar34 = &pSVar43->s3->field_0xdc;
        *(ushort *)puVar34 = *(ushort *)puVar34 | 0x10;
        if (pSVar38 != (SSL_SESSION *)0x0) {
          ssl_update_cache(pSVar43);
        }
        hs->state = 0x15;
        sVar23 = ssl_hs_ok;
      }
LAB_00146e45:
      uVar27 = (uint)local_2e0;
      break;
    case 0x15:
      ssl_do_info_callback(hs->ssl,0x20,1);
      return ssl_hs_ok;
    }
    if (hs->state != uVar27) {
      ssl_do_info_callback(hs->ssl,0x1001,1);
    }
    if (sVar23 != ssl_hs_ok) {
      return sVar23;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t ssl_client_handshake(SSL_HANDSHAKE *hs) {
  while (hs->state != state_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum ssl_client_hs_state_t state =
        static_cast<enum ssl_client_hs_state_t>(hs->state);
    switch (state) {
      case state_start_connect:
        ret = do_start_connect(hs);
        break;
      case state_enter_early_data:
        ret = do_enter_early_data(hs);
        break;
      case state_early_reverify_server_certificate:
        ret = do_early_reverify_server_certificate(hs);
        break;
      case state_read_server_hello:
        ret = do_read_server_hello(hs);
        break;
      case state_tls13:
        ret = do_tls13(hs);
        break;
      case state_read_server_certificate:
        ret = do_read_server_certificate(hs);
        break;
      case state_read_certificate_status:
        ret = do_read_certificate_status(hs);
        break;
      case state_verify_server_certificate:
        ret = do_verify_server_certificate(hs);
        break;
      case state_reverify_server_certificate:
        ret = do_reverify_server_certificate(hs);
        break;
      case state_read_server_key_exchange:
        ret = do_read_server_key_exchange(hs);
        break;
      case state_read_certificate_request:
        ret = do_read_certificate_request(hs);
        break;
      case state_read_server_hello_done:
        ret = do_read_server_hello_done(hs);
        break;
      case state_send_client_certificate:
        ret = do_send_client_certificate(hs);
        break;
      case state_send_client_key_exchange:
        ret = do_send_client_key_exchange(hs);
        break;
      case state_send_client_certificate_verify:
        ret = do_send_client_certificate_verify(hs);
        break;
      case state_send_client_finished:
        ret = do_send_client_finished(hs);
        break;
      case state_finish_flight:
        ret = do_finish_flight(hs);
        break;
      case state_read_session_ticket:
        ret = do_read_session_ticket(hs);
        break;
      case state_process_change_cipher_spec:
        ret = do_process_change_cipher_spec(hs);
        break;
      case state_read_server_finished:
        ret = do_read_server_finished(hs);
        break;
      case state_finish_client_handshake:
        ret = do_finish_client_handshake(hs);
        break;
      case state_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_CONNECT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  ssl_do_info_callback(hs->ssl, SSL_CB_HANDSHAKE_DONE, 1);
  return ssl_hs_ok;
}